

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmValue * CompileVmAssignment(ExpressionContext *ctx,VmModule *module,ExprAssignment *node)

{
  int iVar1;
  bool bVar2;
  VmValue *pVVar3;
  VmInstruction *instInit;
  TypeArray *typeArray;
  VmConstant *pVVar4;
  VmValue **ppVVar5;
  TypeBase *pTVar6;
  SynBase *pSVar7;
  VmInstruction *value;
  VmInstruction *value_00;
  uint i;
  uint uVar8;
  uint in_stack_ffffffffffffff98;
  
  pTVar6 = node->lhs->type;
  if ((pTVar6 == (TypeBase *)0x0) || (pTVar6->typeID != 0x12)) {
    __assert_fail("refType",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xca7,
                  "VmValue *CompileVmAssignment(ExpressionContext &, VmModule *, ExprAssignment *)")
    ;
  }
  if ((TypeBase *)pTVar6[1]._vptr_TypeBase != node->rhs->type) {
    __assert_fail("refType->subType == node->rhs->type",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xca8,
                  "VmValue *CompileVmAssignment(ExpressionContext &, VmModule *, ExprAssignment *)")
    ;
  }
  pVVar3 = CompileVm(ctx,module,node->lhs);
  instInit = (VmInstruction *)CompileVm(ctx,module,node->rhs);
  if (((instInit == (VmInstruction *)0x0) || ((instInit->super_VmValue).typeID != 2)) ||
     (instInit->cmd != VM_INST_ARRAY)) {
    anon_unknown.dwarf_f89de::CreateStore
              (ctx,module,(node->super_ExprBase).source,node->rhs->type,pVVar3,(VmValue *)instInit,0
              );
  }
  else {
    typeArray = (TypeArray *)(node->super_ExprBase).type;
    if ((typeArray == (TypeArray *)0x0) || ((typeArray->super_TypeBase).typeID != 0x13)) {
      typeArray = (TypeArray *)0x0;
    }
    pTVar6 = typeArray->subType;
    bVar2 = IsGoodConstantArray(ctx,module,instInit);
    pSVar7 = (node->super_ExprBase).source;
    if (bVar2) {
      pVVar4 = GetConstantArrayValue(ctx,pSVar7,typeArray,instInit);
      anon_unknown.dwarf_f89de::CreateStore
                (ctx,module,(node->super_ExprBase).source,&typeArray->super_TypeBase,pVVar3,
                 &pVVar4->super_VmValue,0);
      uVar8 = (uint)pVVar4;
      pSVar7 = (node->super_ExprBase).source;
      pTVar6 = node->rhs->type;
    }
    else {
      pVVar4 = anon_unknown.dwarf_f89de::CreateAlloca
                         (ctx,module,pSVar7,node->rhs->type,"array",true);
      for (uVar8 = 0; uVar8 < (instInit->arguments).count; uVar8 = uVar8 + 1) {
        ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&instInit->arguments,uVar8);
        value_00 = (VmInstruction *)*ppVVar5;
        if ((value_00 == (VmInstruction *)0x0) || ((value_00->super_VmValue).typeID != 2)) {
          pSVar7 = (node->super_ExprBase).source;
          iVar1 = (int)pTVar6->size;
LAB_0018b912:
          in_stack_ffffffffffffff98 = iVar1 * uVar8;
          anon_unknown.dwarf_f89de::CreateStore
                    (ctx,module,pSVar7,pTVar6,&pVVar4->super_VmValue,&value_00->super_VmValue,
                     in_stack_ffffffffffffff98);
        }
        else {
          value = value_00;
          if (value_00->cmd == VM_INST_DOUBLE_TO_FLOAT) {
            ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&value_00->arguments,0);
            value = (VmInstruction *)*ppVVar5;
          }
          if (value_00->parent != module->currentBlock) {
            pSVar7 = (node->super_ExprBase).source;
            iVar1 = (int)pTVar6->size;
            value_00 = value;
            goto LAB_0018b912;
          }
          module->currentBlock->insertPoint = value_00;
          in_stack_ffffffffffffff98 = (int)pTVar6->size * uVar8;
          anon_unknown.dwarf_f89de::CreateStore
                    (ctx,module,(node->super_ExprBase).source,pTVar6,&pVVar4->super_VmValue,
                     &value->super_VmValue,in_stack_ffffffffffffff98);
          module->currentBlock->insertPoint = module->currentBlock->lastInstruction;
        }
      }
      uVar8 = (uint)(typeArray->super_TypeBase).size;
      anon_unknown.dwarf_f89de::CreateMemCopy
                (module,(node->super_ExprBase).source,pVVar3,0,&pVVar4->super_VmValue,uVar8,
                 in_stack_ffffffffffffff98);
      pSVar7 = (node->super_ExprBase).source;
      pTVar6 = node->rhs->type;
    }
    instInit = (VmInstruction *)
               anon_unknown.dwarf_f89de::CreateLoad(ctx,module,pSVar7,pTVar6,pVVar3,uVar8);
  }
  pVVar3 = anon_unknown.dwarf_f89de::CheckType(ctx,&node->super_ExprBase,&instInit->super_VmValue);
  return pVVar3;
}

Assistant:

VmValue* CompileVmAssignment(ExpressionContext &ctx, VmModule *module, ExprAssignment *node)
{
	TypeRef *refType = getType<TypeRef>(node->lhs->type);

	(void)refType;
	assert(refType);
	assert(refType->subType == node->rhs->type);

	VmValue *address = CompileVm(ctx, module, node->lhs);

	VmValue *initializer = CompileVm(ctx, module, node->rhs);

	if(VmInstruction *instInit = getType<VmInstruction>(initializer))
	{
		// Array initializers are compiled to per-element assignments
		if(instInit->cmd == VM_INST_ARRAY)
		{
			TypeArray *typeArray = getType<TypeArray>(node->type);

			TypeBase *elementType = typeArray->subType;

			if(IsGoodConstantArray(ctx, module, instInit))
			{
				VmValue *constant = GetConstantArrayValue(ctx, node->source, typeArray, instInit);

				CreateStore(ctx, module, node->source, typeArray, address, constant, 0);

				VmValue *copy = CreateLoad(ctx, module, node->source, node->rhs->type, address, 0);

				return CheckType(ctx, node, copy);
			}

			VmConstant *tempAddress = CreateAlloca(ctx, module, node->source, node->rhs->type, "array", true);

			for(unsigned i = 0; i < instInit->arguments.size(); i++)
			{
				VmValue *element = instInit->arguments[i];

				VmInstruction *elementInst = getType<VmInstruction>(element);

				if(elementInst)
				{
					if(elementInst->cmd == VM_INST_DOUBLE_TO_FLOAT)
						element = elementInst->arguments[0];

					if(elementInst->parent == module->currentBlock)
					{
						module->currentBlock->insertPoint = elementInst;

						CreateStore(ctx, module, node->source, elementType, tempAddress, element, unsigned(elementType->size * i));

						module->currentBlock->insertPoint = module->currentBlock->lastInstruction;
					}
					else
					{
						CreateStore(ctx, module, node->source, elementType, tempAddress, element, unsigned(elementType->size * i));
					}
				}
				else
				{
					CreateStore(ctx, module, node->source, elementType, tempAddress, element, unsigned(elementType->size * i));
				}
			}

			CreateMemCopy(module, node->source, address, 0, tempAddress, 0, int(typeArray->size));

			VmValue *copy = CreateLoad(ctx, module, node->source, node->rhs->type, address, 0);

			return CheckType(ctx, node, copy);
		}
	}

	CreateStore(ctx, module, node->source, node->rhs->type, address, initializer, 0);

	return CheckType(ctx, node, initializer);
}